

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O0

bool __thiscall kws::Parser::InitIndentation(Parser *this)

{
  unsigned_long uVar1;
  char cVar2;
  bool bVar3;
  reference puVar4;
  reference puVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  Parser *pPVar10;
  long in_RDI;
  IndentPosition tempind_1;
  size_t ic_1;
  IndentPosition localind_1;
  size_t column_1;
  IndentPosition localindtemp;
  size_t localposColumnComments_1;
  size_t insideBracket;
  size_t insideSwitch;
  size_t previousCase;
  bool firstCase;
  size_t posCase;
  IndentPosition tempind;
  size_t ic;
  size_t column;
  size_t j;
  IndentPosition localind;
  size_t localposColumnComments;
  size_t nestedSwitch;
  size_t defaultPos;
  IndentPosition ind_3;
  size_t posColumnComments;
  size_t closingBracket;
  size_t openningBracket;
  size_t posSwitch;
  IndentPosition ind_2;
  size_t posMainComments;
  size_t bracket;
  unsigned_long pos;
  bool valid;
  size_t posMain;
  IndentPosition ind_1;
  size_t posClassComments;
  iterator itname;
  bool defined;
  const_iterator itN_1;
  bool isNamespace_1;
  size_t close;
  const_iterator itN;
  bool isNamespace;
  size_t open;
  uint nClose;
  uint nOpen;
  size_t posClass;
  iterator itIdentPos;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacePos;
  IndentPosition ind;
  size_t posNamespaceComments;
  size_t posNamespace2;
  size_t posNamespace1;
  size_t posNamespace;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacevec;
  vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
  *in_stack_fffffffffffff7f8;
  __normal_iterator<kws::IndentPositionStruct_*,_std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>_>
  *in_stack_fffffffffffff800;
  Parser *in_stack_fffffffffffff808;
  allocator *in_stack_fffffffffffff810;
  char *in_stack_fffffffffffff828;
  Parser *in_stack_fffffffffffff830;
  undefined7 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff83f;
  char *in_stack_fffffffffffff840;
  Parser *in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff857;
  string *in_stack_fffffffffffff890;
  allocator *paVar11;
  undefined1 in_stack_fffffffffffff89f;
  size_t in_stack_fffffffffffff8a0;
  Parser *in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8b8;
  char *in_stack_fffffffffffff8c0;
  char *in_stack_fffffffffffff8c8;
  char *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  bool local_709;
  byte local_5b2;
  byte local_572;
  bool local_551;
  allocator local_521;
  string local_520 [32];
  Parser *local_500;
  undefined4 local_4f8;
  undefined4 local_4f4;
  Parser *local_4d0;
  Parser *local_4c8;
  undefined4 local_4c0;
  uint local_4bc;
  long local_498;
  Parser *local_490;
  undefined4 local_488;
  undefined4 local_484;
  Parser *local_460;
  allocator local_451;
  string local_450 [32];
  undefined8 local_430;
  ulong local_428;
  ulong local_420;
  byte local_411;
  ulong local_410;
  allocator local_401;
  string local_400 [32];
  string local_3e0;
  ulong local_3b0;
  size_t local_3a8;
  ulong local_3a0;
  size_t local_398;
  undefined4 local_390;
  undefined4 local_38c;
  size_t local_368;
  ulong local_360;
  ulong local_358;
  size_t local_350;
  undefined4 local_348;
  undefined4 local_344;
  size_t local_320;
  allocator local_311;
  string local_310 [32];
  size_t local_2f0;
  ulong local_2e8;
  long local_2e0;
  allocator local_2d1;
  string local_2d0 [32];
  size_t local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  size_t local_280;
  long local_278;
  ulong local_270;
  byte local_261;
  long local_260;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  size_t local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d4;
  size_t local_1b0;
  unsigned_long *local_1a8;
  unsigned_long *local_1a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_198;
  byte local_189;
  unsigned_long *local_188;
  unsigned_long *local_180;
  unsigned_long *local_178;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_170;
  byte local_164;
  byte local_163;
  byte local_162;
  allocator local_161;
  string local_160 [32];
  ulong local_140;
  unsigned_long *local_138;
  unsigned_long *local_130;
  unsigned_long *local_128;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120;
  byte local_114;
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [32];
  ulong local_f0;
  int local_e8;
  int local_e4;
  ulong local_e0;
  IndentPositionStruct *local_d8;
  IndentPositionStruct *local_d0;
  __normal_iterator<kws::IndentPositionStruct_*,_std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>_>
  local_c8 [4];
  allocator local_a1;
  string local_a0 [32];
  size_t local_80;
  undefined4 local_78;
  undefined4 local_74;
  size_t local_40;
  ulong local_38;
  ulong local_30;
  long local_28;
  
  std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::clear
            ((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *)
             0x1a742b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a7438);
  local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5c99);
  while (local_28 != -1) {
    local_30 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1d7c9a);
    if ((local_30 != 0xffffffffffffffff) &&
       ((local_38 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e54be),
        local_38 == 0xffffffffffffffff || (local_30 < local_38)))) {
      local_40 = GetPositionWithComments
                           (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
      IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a7530);
      local_80 = local_40;
      local_78 = 0;
      local_74 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff810,
                 (value_type_conflict *)in_stack_fffffffffffff808);
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                ((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *)
                 in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"",&local_a1);
      local_80 = FindClosingChar((Parser *)
                                 CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                 (char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                 (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                 (size_t)in_stack_fffffffffffff8c8,
                                 SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                 in_stack_fffffffffffff8b8);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff810,
                 (value_type_conflict *)in_stack_fffffffffffff808);
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                ((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *)
                 in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
      IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a766e);
    }
    local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5c99);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a773b);
  local_c8[0]._M_current =
       (IndentPositionStruct *)
       std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::begin
                 (in_stack_fffffffffffff7f8);
  while( true ) {
    local_d0 = (IndentPositionStruct *)
               std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
               end(in_stack_fffffffffffff7f8);
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff800,
                       (__normal_iterator<kws::IndentPositionStruct_*,_std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>_>
                        *)in_stack_fffffffffffff7f8);
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<kws::IndentPositionStruct_*,_std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>_>
    ::operator*(local_c8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff810,
               (value_type_conflict *)in_stack_fffffffffffff808);
    local_d8 = (IndentPositionStruct *)
               __gnu_cxx::
               __normal_iterator<kws::IndentPositionStruct_*,_std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>_>
               ::operator++((__normal_iterator<kws::IndentPositionStruct_*,_std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>_>
                             *)in_stack_fffffffffffff808,
                            (int)((ulong)in_stack_fffffffffffff800 >> 0x20));
  }
  cVar2 = (char)in_RDI;
  local_e0 = std::__cxx11::string::find(cVar2 + '\x18',0x7b);
  while( true ) {
    local_551 = false;
    if (local_e0 != 0xffffffffffffffff) {
      GetPositionWithComments(in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
      local_551 = IsInElseForbiddenSection
                            ((Parser *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838)
                             ,(size_t)in_stack_fffffffffffff830);
    }
    if (local_551 == false) break;
    local_e0 = std::__cxx11::string::find(cVar2 + '\x18',0x7b);
  }
  do {
    if (local_e0 == 0xffffffffffffffff) {
      local_260 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca3);
      while (local_260 != -1) {
        local_261 = 1;
        local_270 = local_260 + 5;
        while( true ) {
          uVar9 = local_270;
          uVar7 = std::__cxx11::string::size();
          bVar3 = false;
          if (uVar9 < uVar7) {
            pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            bVar3 = true;
            if (*pcVar8 != ' ') {
              pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
              bVar3 = true;
              if (*pcVar8 != '\r') {
                pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
                bVar3 = *pcVar8 == '\n';
              }
            }
          }
          if (!bVar3) break;
          local_270 = local_270 + 1;
        }
        pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if (*pcVar8 != '(') {
          local_261 = 0;
        }
        if (((local_261 & 1) != 0) &&
           (local_278 = std::__cxx11::string::find(cVar2 + '\x18',0x7b), local_278 != -1)) {
          local_280 = GetPositionWithComments
                                (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
          IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a8651);
          local_2b0 = local_280;
          local_2a8 = 0;
          local_2a4 = 1;
          std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
          push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *
                    )in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2d0,"",&local_2d1);
          local_2b0 = FindClosingChar((Parser *)
                                      CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                      (char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                      (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                      (size_t)in_stack_fffffffffffff8c8,
                                      SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                      in_stack_fffffffffffff8b8);
          std::__cxx11::string::~string(local_2d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
          local_2a8 = 0xffffffff;
          local_2a4 = 0xffffffff;
          std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
          push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *
                    )in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
          IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a8777);
        }
        local_260 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca3);
      }
      local_2e0 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca8);
      do {
        while( true ) {
          if (local_2e0 == -1) {
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            AddIndent((Parser *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                      (char *)in_stack_fffffffffffff848,
                      (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840
                     );
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff810);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff810);
            return true;
          }
          bVar3 = CheckValidSwitchStatement
                            (in_stack_fffffffffffff808,
                             (uint)((ulong)in_stack_fffffffffffff800 >> 0x20));
          if (bVar3) break;
          local_2e0 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca8);
        }
        local_2e8 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1d7c9a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_310,"",&local_311);
        sVar6 = FindClosingChar((Parser *)
                                CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                (char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                (size_t)in_stack_fffffffffffff8c8,
                                SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                in_stack_fffffffffffff8b8);
        std::__cxx11::string::~string(local_310);
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
        local_2f0 = sVar6;
        local_320 = GetPositionWithComments
                              (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
        IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a89bf);
        local_350 = local_320;
        local_348 = 0xffffffff;
        local_344 = 0xfffffffe;
        std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
        push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *)
                  in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
        local_358 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5caf);
        if (local_2f0 < local_358) {
          local_358 = 0xffffffffffffffff;
        }
        local_360 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca8);
        while (local_360 != 0xffffffffffffffff) {
          bVar3 = CheckValidSwitchStatement
                            (in_stack_fffffffffffff808,
                             (uint)((ulong)in_stack_fffffffffffff800 >> 0x20));
          if (bVar3) {
            if (local_358 <= local_360) break;
            local_358 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5caf);
            local_360 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca8);
          }
          else {
            local_360 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca8);
          }
        }
        if (local_358 != 0xffffffffffffffff) {
          local_368 = GetPositionWithComments
                                (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
          IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a8c0d);
          local_398 = local_368;
          local_3a0 = local_358;
          do {
            local_3a0 = local_3a0 - 1;
            if (local_3a0 == 0xffffffffffffffff) break;
            pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          } while (((*pcVar8 == ' ') ||
                   (pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518),
                   *pcVar8 == '\n')) ||
                  (pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518),
                  *pcVar8 == '\r'));
          if (local_3a0 == local_2e8) {
            local_390 = 0;
          }
          else {
            local_390 = 0xffffffff;
          }
          local_38c = 0;
          std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
          push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *
                    )in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
          local_3a8 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6615);
          local_3a8 = GetPositionWithComments
                                (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
          local_3b0 = local_3a8;
          do {
            local_3b0 = local_3b0 + 1;
            uVar9 = local_3b0;
            uVar7 = std::__cxx11::string::size();
            local_709 = false;
            if (uVar9 < uVar7) {
              pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
              in_stack_fffffffffffff8df = true;
              local_709 = (bool)in_stack_fffffffffffff8df;
              if (*pcVar8 != ' ') {
                in_stack_fffffffffffff8d0 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8)
                ;
                in_stack_fffffffffffff8df = true;
                local_709 = (bool)in_stack_fffffffffffff8df;
                if (*in_stack_fffffffffffff8d0 != '\r') {
                  in_stack_fffffffffffff8c8 =
                       (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
                  in_stack_fffffffffffff8df = *in_stack_fffffffffffff8c8 == '\n';
                  local_709 = (bool)in_stack_fffffffffffff8df;
                }
              }
            }
          } while (local_709 != false);
          in_stack_fffffffffffff8c0 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
          if (*in_stack_fffffffffffff8c0 == '{') {
            in_stack_fffffffffffff8b8 = &local_3e0;
            IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a8f5e);
            local_3e0._0_8_ = local_3b0;
            local_3e0._M_string_length._0_4_ = 0;
            local_3e0._M_string_length._4_4_ = 0;
            std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
            push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                       *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_400,"",&local_401);
            local_3e0._0_8_ =
                 FindClosingChar((Parser *)
                                 CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                 (char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                 (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                 (size_t)in_stack_fffffffffffff8c8,
                                 SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                 in_stack_fffffffffffff8b8);
            std::__cxx11::string::~string(local_400);
            std::allocator<char>::~allocator((allocator<char> *)&local_401);
            local_3e0._M_string_length._0_4_ = 0;
            local_3e0._M_string_length._4_4_ = 0;
            std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
            push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                       *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
            IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a9084);
          }
          IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a90fc);
        }
        local_410 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5cb7);
        local_411 = 1;
        local_420 = local_2e8;
        while (local_410 != 0xffffffffffffffff && local_410 < local_2f0) {
          local_428 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca8);
          if ((local_2e8 < local_428) && (local_428 < local_410)) {
            local_430 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1d7c9a);
            paVar11 = &local_451;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_450,"",paVar11);
            local_410 = FindClosingChar((Parser *)
                                        CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8
                                                ),(char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                        (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                        (size_t)in_stack_fffffffffffff8c8,
                                        SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                        in_stack_fffffffffffff8b8);
            std::__cxx11::string::~string(local_450);
            std::allocator<char>::~allocator((allocator<char> *)&local_451);
          }
          else {
            local_460 = (Parser *)
                        GetPositionWithComments
                                  (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
            IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a9341);
            local_490 = local_460;
            if ((local_411 & 1) == 0) {
              local_488 = 0xffffffff;
            }
            else {
              local_488 = 0;
            }
            local_484 = 0;
            std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
            push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                       *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
            local_498 = std::__cxx11::string::find(cVar2 + '\x18',0x3a);
            while( true ) {
              uVar9 = local_498 + 1;
              uVar7 = std::__cxx11::string::size();
              bVar3 = false;
              if (uVar9 < uVar7) {
                pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
                bVar3 = *pcVar8 == ':';
              }
              if (!bVar3) break;
              local_498 = std::__cxx11::string::find(cVar2 + '\x18',0x3a);
            }
            if (local_498 != -1) {
              local_460 = (Parser *)
                          GetPositionWithComments
                                    (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
              IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a94d3);
              local_4c8 = local_460;
              bVar3 = (local_411 & 1) == 0;
              if (bVar3) {
                local_4c0 = 0xffffffff;
              }
              else {
                local_4c0 = 0;
              }
              local_4bc = (uint)!bVar3;
              std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
              push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                         *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
              local_4d0 = local_460;
              do {
                local_4d0 = (Parser *)
                            ((long)&(local_4d0->m_ErrorList).
                                    super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
                in_stack_fffffffffffff848 = local_4d0;
                pPVar10 = (Parser *)std::__cxx11::string::size();
                in_stack_fffffffffffff857 = false;
                if (in_stack_fffffffffffff848 < pPVar10) {
                  in_stack_fffffffffffff840 =
                       (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
                  in_stack_fffffffffffff857 = true;
                  if (*in_stack_fffffffffffff840 != ' ') {
                    in_stack_fffffffffffff830 =
                         (Parser *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
                    in_stack_fffffffffffff857 = true;
                    if (*(char *)&(in_stack_fffffffffffff830->m_ErrorList).
                                  super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                  ._M_impl.super__Vector_impl_data._M_start != '\r') {
                      in_stack_fffffffffffff828 =
                           (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
                      in_stack_fffffffffffff857 = *in_stack_fffffffffffff828 == '\n';
                    }
                  }
                }
              } while ((bool)in_stack_fffffffffffff857 != false);
              pcVar8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
              if (*pcVar8 == '{') {
                IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a96b0);
                local_500 = local_4d0;
                local_4f8 = 0;
                local_4f4 = 0;
                std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
                push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                           *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
                in_stack_fffffffffffff810 = &local_521;
                in_stack_fffffffffffff808 = local_4d0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_520,"",in_stack_fffffffffffff810);
                in_stack_fffffffffffff800 =
                     (__normal_iterator<kws::IndentPositionStruct_*,_std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>_>
                      *)FindClosingChar((Parser *)
                                        CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8
                                                ),(char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                        (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                        (size_t)in_stack_fffffffffffff8c8,
                                        SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                        in_stack_fffffffffffff8b8);
                local_500 = (Parser *)in_stack_fffffffffffff800;
                std::__cxx11::string::~string(local_520);
                std::allocator<char>::~allocator((allocator<char> *)&local_521);
                local_4f8 = 0;
                local_4f4 = 0;
                std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
                push_back((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                           *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
                IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a97c1);
              }
              IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a9839);
            }
            IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a9857);
          }
          local_411 = 0;
          local_420 = local_410;
          local_410 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5cb7);
        }
        local_2e0 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5ca8);
        IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a98f3);
      } while( true );
    }
    local_e4 = 0;
    local_e8 = 0;
    local_f0 = std::__cxx11::string::find(cVar2 + '\x18',0x7b);
    while (local_f0 != 0xffffffffffffffff && local_f0 < local_e0) {
      local_112 = 0;
      local_113 = 0;
      GetPositionWithComments(in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
      bVar3 = IsInElseForbiddenSection
                        ((Parser *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                         (size_t)in_stack_fffffffffffff830);
      local_572 = 0;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_112 = 1;
        std::__cxx11::string::string(local_110,"",&local_111);
        local_113 = 1;
        bVar3 = IsBetweenQuote(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                               (bool)in_stack_fffffffffffff89f,in_stack_fffffffffffff890);
        local_572 = bVar3 ^ 0xff;
      }
      if ((local_113 & 1) != 0) {
        std::__cxx11::string::~string(local_110);
      }
      if ((local_112 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
      if ((local_572 & 1) != 0) {
        local_114 = 0;
        local_128 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff7f8);
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffff800,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffff7f8);
        while( true ) {
          local_130 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff7f8);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff800,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff7f8);
          if (!bVar3) break;
          puVar4 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_120);
          uVar1 = *puVar4;
          sVar6 = GetPositionWithComments
                            (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
          if (uVar1 == sVar6) {
            local_114 = 1;
          }
          local_138 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffff808,
                                   (int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        }
        if ((local_114 & 1) == 0) {
          local_e4 = local_e4 + 1;
        }
      }
      local_f0 = std::__cxx11::string::find(cVar2 + '\x18',0x7b);
    }
    local_140 = std::__cxx11::string::find(cVar2 + '\x18',0x7d);
    while (local_140 != 0xffffffffffffffff && local_140 < local_e0) {
      local_162 = 0;
      local_163 = 0;
      GetPositionWithComments(in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
      bVar3 = IsInElseForbiddenSection
                        ((Parser *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                         (size_t)in_stack_fffffffffffff830);
      local_5b2 = 0;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_162 = 1;
        std::__cxx11::string::string(local_160,"",&local_161);
        local_163 = 1;
        bVar3 = IsBetweenQuote(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                               (bool)in_stack_fffffffffffff89f,in_stack_fffffffffffff890);
        local_5b2 = bVar3 ^ 0xff;
      }
      if ((local_163 & 1) != 0) {
        std::__cxx11::string::~string(local_160);
      }
      if ((local_162 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
      }
      if ((local_5b2 & 1) != 0) {
        local_164 = 0;
        local_178 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff7f8);
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffff800,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffff7f8);
        while( true ) {
          local_180 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff7f8);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff800,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff7f8);
          if (!bVar3) break;
          puVar4 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_170);
          uVar1 = *puVar4;
          sVar6 = GetPositionWithComments
                            (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
          if (uVar1 == sVar6) {
            local_164 = 1;
          }
          local_188 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffff808,
                                   (int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        }
        if ((local_164 & 1) == 0) {
          local_e8 = local_e8 + 1;
        }
      }
      local_140 = std::__cxx11::string::find(cVar2 + '\x18',0x7d);
    }
    local_189 = 0;
    if (local_e8 == local_e4) {
      local_198._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff7f8);
      while( true ) {
        local_1a0 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff7f8);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff800,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff7f8);
        if (!bVar3) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_198);
        uVar1 = *puVar5;
        sVar6 = GetPositionWithComments(in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828)
        ;
        if (uVar1 == sVar6) {
          local_189 = 1;
          break;
        }
        local_1a8 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff808,
                                 (int)((ulong)in_stack_fffffffffffff800 >> 0x20));
      }
    }
    if ((local_e8 == local_e4) && ((local_189 & 1) == 0)) {
      local_1b0 = GetPositionWithComments
                            (in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
      IndentPositionStruct::IndentPositionStruct((IndentPositionStruct *)0x1a8064);
      local_1e0 = local_1b0;
      local_1d8 = 0;
      local_1d4 = 1;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                ((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *)
                 in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"",&local_201);
      local_1e0 = FindClosingChar((Parser *)
                                  CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                  (char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                  (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                  (size_t)in_stack_fffffffffffff8c8,
                                  SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                  in_stack_fffffffffffff8b8);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      while( true ) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"",&local_229);
        bVar3 = IsBetweenQuote(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                               (bool)in_stack_fffffffffffff89f,in_stack_fffffffffffff890);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        if (!bVar3) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_250,"",&local_251);
        local_1e0 = FindClosingChar((Parser *)
                                    CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                    (char)((ulong)in_stack_fffffffffffff8d0 >> 0x38),
                                    (char)((ulong)in_stack_fffffffffffff8d0 >> 0x30),
                                    (size_t)in_stack_fffffffffffff8c8,
                                    SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x38,0),
                                    in_stack_fffffffffffff8b8);
        std::__cxx11::string::~string(local_250);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
      }
      local_1d8 = 0xffffffff;
      local_1d4 = 0xffffffff;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                ((vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *)
                 in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
      IndentPositionStruct::~IndentPositionStruct((IndentPositionStruct *)0x1a83bc);
    }
    local_e0 = std::__cxx11::string::find(cVar2 + '\x18',0x7b);
  } while( true );
}

Assistant:

bool Parser::InitIndentation()
{
  m_IdentPositionVector.clear();

  // namespace
  std::vector<size_t> namespacevec;

  size_t posNamespace = m_BufferNoComment.find("namespace",0);
  while(posNamespace!=std::string::npos)
    {
    size_t posNamespace1 = m_BufferNoComment.find("{",posNamespace);
    if(posNamespace1 != std::string::npos)
      {
      size_t posNamespace2 = m_BufferNoComment.find(";",posNamespace);
      if((posNamespace2 == std::string::npos) || (posNamespace2 > posNamespace1))
        {
        size_t posNamespaceComments = this->GetPositionWithComments(posNamespace1);
        IndentPosition ind;
        ind.position = posNamespaceComments;
        ind.current = 0;
        ind.after = 0;
        namespacevec.push_back(posNamespaceComments);
        //std::cout << "Found Namespace at: " << this->GetLineNumber(posNamespaceComments) << std::endl;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posNamespaceComments);
        namespacevec.push_back(ind.position);
        m_IdentPositionVector.push_back(ind);
        }
      }
    posNamespace = m_BufferNoComment.find("namespace",posNamespace+1);
    }

  // Create a list of position specific for namespaces
  std::vector<size_t> namespacePos;
  auto itIdentPos = m_IdentPositionVector.begin();
  while(itIdentPos != m_IdentPositionVector.end())
    {
    namespacePos.push_back((*itIdentPos).position);
    itIdentPos++;
    }

  // Check if the { is the first in the file/function or in a namespace
  size_t posClass = m_BufferNoComment.find('{',0);

  while(posClass!= std::string::npos && this->IsInElseForbiddenSection(this->GetPositionWithComments(posClass)))
    {
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  while(posClass != std::string::npos)
    {
    // We count the number of { and } before posClass
    unsigned int nOpen = 0;
    unsigned int nClose = 0;

    size_t open = m_BufferNoComment.find('{',0);
    while(open!=std::string::npos && open<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(open))
        && !this->IsBetweenQuote(open)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(open))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nOpen++;
          }
        }
      open = m_BufferNoComment.find('{',open+1);
      }

    size_t close = m_BufferNoComment.find('}',0);
    while(close!=std::string::npos && close<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(close))
        && !this->IsBetweenQuote(close)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(close))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nClose++;
          }
        }
      close = m_BufferNoComment.find('}',close+1);
      }

    bool defined = false;

    if(nClose == nOpen)
      {
      // Check if this is not the namespace previously defined
      auto itname = namespacevec.begin();
      while(itname != namespacevec.end())
        {
        if((*itname) == this->GetPositionWithComments(posClass))
          {
          defined = true;
          break;
          }
        itname++;
        }
      }

    if((nClose == nOpen) && !defined)
      {
      // translate the position in the buffer position;
      size_t posClassComments = this->GetPositionWithComments(posClass);
      IndentPosition ind;
      ind.position = posClassComments;
      ind.current = 0;
      ind.after = 1;
      m_IdentPositionVector.push_back(ind);
      ind.position = this->FindClosingChar('{','}',posClassComments);
      while(this->IsBetweenQuote(ind.position,true))
        {
        ind.position = this->FindClosingChar('{','}',ind.position+1);
        }
      ind.current = -1;
      ind.after = -1;
      m_IdentPositionVector.push_back(ind);
      }
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  // int main()
  size_t posMain = m_BufferNoComment.find("main",0);
  while(posMain != std::string::npos)
    {
    // Check if the next char is '('
    bool valid = true;
    auto pos = static_cast<unsigned long>(posMain + 5);
    while(pos<m_BufferNoComment.size()
         && (m_BufferNoComment[pos]==' '
         || m_BufferNoComment[pos]=='\r'
         || m_BufferNoComment[pos]=='\n')
         )
      {
      pos++;
      }

    if(m_BufferNoComment[pos]!='(')
      {
      valid = false;
      }
    if(valid)
      {
      size_t bracket = m_BufferNoComment.find('{',posMain+4);
      if(bracket != std::string::npos)
        {
        // translate the position in the buffer position;
        size_t posMainComments = this->GetPositionWithComments(bracket);
        IndentPosition ind;
        ind.position = posMainComments;
        ind.current = 0;
        ind.after = 1;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posMainComments);
        ind.current = -1;
        ind.after = -1;
        m_IdentPositionVector.push_back(ind);
        }
      }
    posMain = m_BufferNoComment.find("main",posMain+4);
    }

  // switch/case statement
  // for the moment break; restore the indentation
  size_t posSwitch = m_BufferNoComment.find("switch",0);
  while(posSwitch != std::string::npos)
    {
    // Check that it is a valid switch statement
    if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(posSwitch)))
     {
     posSwitch = m_BufferNoComment.find("switch",posSwitch+1);
     continue;
     }

    // If this is the first case we find the openning { in order to
    // find the closing } of the switch statement
    size_t openningBracket = m_BufferNoComment.find("{",posSwitch);
    size_t closingBracket = this->FindClosingChar('{','}',openningBracket,true);
    size_t posColumnComments = this->GetPositionWithComments(closingBracket);
    IndentPosition ind;
    ind.position = posColumnComments;
    ind.current = -1;
    ind.after = -2;
    m_IdentPositionVector.push_back(ind);

    // Do the default case
    size_t defaultPos = m_BufferNoComment.find("default",openningBracket);
    if(defaultPos > closingBracket)
      {
      defaultPos = std::string::npos;
      }

    // We need to make sure that there is no "switch" statement nested
    size_t nestedSwitch = m_BufferNoComment.find("switch",posSwitch+1);
    while(nestedSwitch != std::string::npos)
      {
        if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(nestedSwitch)))
        {
        nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
        continue;
        }

      if(nestedSwitch < defaultPos)
        {
        defaultPos = m_BufferNoComment.find("default",defaultPos+1);
        }
      else
        {
        break;
        }
      nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
      }

    if(defaultPos != std::string::npos)
      {
      size_t localposColumnComments = this->GetPositionWithComments(defaultPos);
      IndentPosition localind;
      localind.position = localposColumnComments;

      // The current indent should be -1 unless we are right after the openning
      // bracket. In that case the current indent should be 0;
      size_t j=defaultPos-1;
      while(j!=std::string::npos)
        {
        if(m_BufferNoComment[j] != ' '
          && m_BufferNoComment[j] != '\n'
          && m_BufferNoComment[j] != '\r'
          )
          {
          break;
          }
        j--;
        }

      if(j == openningBracket)
        {
        localind.current = 0;
        }
      else
        {
        localind.current = -1;
        }

      localind.after = 0;
      m_IdentPositionVector.push_back(localind);
      // Find the ':' after the default
      size_t column = m_BufferNoComment.find(":",defaultPos+1);
      column = this->GetPositionWithComments(column);

      // Sometimes there is a { right after the : we skip it if this is
      // the case
      size_t ic = column+1;
      while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
        {
        ic++;
        }
      if(m_Buffer[ic] == '{')
        {
        IndentPosition tempind;
        tempind.position = ic;
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        tempind.position = this->FindClosingChar('{','}',ic);
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        }
      }

    size_t posCase = m_BufferNoComment.find("case",openningBracket);
    bool firstCase = true;
    size_t previousCase = openningBracket;

    while(posCase!= std::string::npos && posCase<closingBracket)
      {
      // Check if we don't have any switch statement inside
      size_t insideSwitch = m_BufferNoComment.find("switch",previousCase);
      if(insideSwitch>openningBracket && insideSwitch<posCase)
        {
        // jump to the end of the inside switch/case
        size_t insideBracket = m_BufferNoComment.find("{",insideSwitch);
        posCase = this->FindClosingChar('{','}',insideBracket,true);
        }
      else
        {
        size_t localposColumnComments = this->GetPositionWithComments(posCase);
        IndentPosition localindtemp;
        localindtemp.position = localposColumnComments;
        if(firstCase)
          {
          localindtemp.current = 0;
          }
        else
          {
          localindtemp.current = -1;
          }
        localindtemp.after = 0;

        m_IdentPositionVector.push_back(localindtemp);

        size_t column = m_BufferNoComment.find(':',posCase+3);
        // Make sure that we are not checing '::'
        while(column+1<m_BufferNoComment.size()
          && m_BufferNoComment[column+1]==':')
          {
          column = m_BufferNoComment.find(':',column+2);
          }

        if(column != std::string::npos)
          {
          // translate the position in the buffer position;
          localposColumnComments = this->GetPositionWithComments(column);
          IndentPosition localind;
          localind.position = localposColumnComments;
          if(firstCase)
            {
            localind.current = 0;
            localind.after = 1;
            }
          else
            {
            localind.current = -1;
            localind.after = 0;
            }
          m_IdentPositionVector.push_back(localind);

          // Sometimes there is a { right after the : we skip it if this is
          // the case
          size_t ic = localposColumnComments+1;
          while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
            {
            ic++;
            }
          if(m_Buffer[ic] == '{')
            {
            IndentPosition tempind;
            tempind.position = ic;
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            tempind.position = this->FindClosingChar('{','}',ic);
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            }
          }
        }
      firstCase = false;
      previousCase = posCase;
      posCase = m_BufferNoComment.find("case",posCase+1);
      }

    posSwitch = m_BufferNoComment.find("switch",posSwitch+3);
    }

  // Some words should be indented as the previous indent
  this->AddIndent("public:",-1,0);
  this->AddIndent("private:",-1,0);
  this->AddIndent("protected:",-1,0);
  this->AddIndent("signals:",-1,0);
  this->AddIndent("public slots:",-1,0);
  this->AddIndent("private slots:",-1,0);
  this->AddIndent("protected slots:",-1,0);

  // some words should be always align left
  this->AddIndent("#include",ALIGN_LEFT,0);
  this->AddIndent("#if",ALIGN_LEFT,0);
  //this->AddIndent("#ifdef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#elif",ALIGN_LEFT,0);
  this->AddIndent("#else",ALIGN_LEFT,0);
  this->AddIndent("#endif",ALIGN_LEFT,0);
  //this->AddIndent("#ifndef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#define",ALIGN_LEFT,0);
  this->AddIndent("#undef",ALIGN_LEFT,0);

  return true;
}